

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O2

void __thiscall
TPZEqnArray<std::complex<long_double>_>::Write
          (TPZEqnArray<std::complex<long_double>_> *this,FILE *outputfile)

{
  ostream *poVar1;
  int aux;
  
  fwrite(&this->fNumEq,4,1,(FILE *)outputfile);
  fwrite(&this->fLastTerm,4,1,(FILE *)outputfile);
  aux = (int)(this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fNElements;
  if (aux == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "void TPZEqnArray<std::complex<long double>>::Write(FILE *) [TVar = std::complex<long double>]"
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xc9);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  fwrite(&aux,4,1,(FILE *)outputfile);
  fwrite((this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore,4,(long)aux,
         (FILE *)outputfile);
  aux = (int)(this->fEqNumber).super_TPZManVector<int,_100>.super_TPZVec<int>.fNElements;
  if (aux == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "void TPZEqnArray<std::complex<long double>>::Write(FILE *) [TVar = std::complex<long double>]"
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xd2);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  fwrite(&aux,4,1,(FILE *)outputfile);
  fwrite((this->fEqNumber).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore,4,(long)aux,
         (FILE *)outputfile);
  aux = (int)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fNElements;
  fwrite(&aux,4,1,(FILE *)outputfile);
  fwrite((this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore,4,(long)aux,
         (FILE *)outputfile);
  aux = (int)(this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
             super_TPZVec<std::complex<long_double>_>.fNElements;
  fwrite(&aux,4,1,(FILE *)outputfile);
  fwrite((this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
         super_TPZVec<std::complex<long_double>_>.fStore,8,(long)aux,(FILE *)outputfile);
  return;
}

Assistant:

void TPZEqnArray<TVar>::Write(FILE * outputfile){
	/** Number of equations */
	fwrite(&fNumEq,sizeof(int),1,outputfile);
	//cout << ftell(outputfile) << endl;
	/** Last term added*/
	fwrite(&fLastTerm,sizeof(int),1,outputfile);
	//cout << ftell(outputfile) << endl;
	/** TPZStack fEqStart data */
	int aux = fEqStart.NElements();
	if(aux == 0) 
	{
		std::cout << __PRETTY_FUNCTION__ << __LINE__ << std::endl;
	}
	fwrite(&aux,sizeof(int),1,outputfile);
	fwrite(&fEqStart[0],sizeof(int), aux ,outputfile);
	
	/** TPZStack fEqNumber data */
	aux = fEqNumber.NElements();
	if(aux == 0) 
	{
		std::cout << __PRETTY_FUNCTION__ << __LINE__ << std::endl;
	}
	fwrite(&aux,sizeof(int),1,outputfile);
	fwrite(&fEqNumber[0],sizeof(int), aux ,outputfile);
	
	/** TPZStack fIndex data */
	aux = fIndex.NElements();
	fwrite(&aux,sizeof(int),1,outputfile);
	fwrite(&fIndex[0],sizeof(int), aux ,outputfile);
	
	/** TPZStack fEqValues data */
	aux = fEqValues.NElements();
	fwrite(&aux,sizeof(int),1,outputfile);
	fwrite(&fEqValues[0],sizeof(REAL), aux ,outputfile);
}